

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelocDirWrapper.cpp
# Opt level: O0

void * __thiscall RelocEntryWrapper::getPtr(RelocEntryWrapper *this)

{
  size_t sVar1;
  void *pvVar2;
  WORD *ptr;
  WORD *entriesPtr;
  size_t maxNum;
  RelocEntryWrapper *this_local;
  
  if (this->parentDir == (RelocBlockWrapper *)0x0) {
    this_local = (RelocEntryWrapper *)0x0;
  }
  else {
    sVar1 = RelocBlockWrapper::maxEntriesNumInBlock(this->parentDir);
    if ((this->super_ExeNodeWrapper).entryNum < sVar1) {
      pvVar2 = RelocBlockWrapper::getEntriesPtr(this->parentDir);
      if (pvVar2 == (void *)0x0) {
        this_local = (RelocEntryWrapper *)0x0;
      }
      else {
        this_local = (RelocEntryWrapper *)((long)pvVar2 + (this->super_ExeNodeWrapper).entryNum * 2)
        ;
      }
    }
    else {
      this_local = (RelocEntryWrapper *)0x0;
    }
  }
  return this_local;
}

Assistant:

void* RelocEntryWrapper::getPtr()
{
    if (this->parentDir == NULL) return NULL;

    size_t maxNum = this->parentDir->maxEntriesNumInBlock();
    if (this->entryNum >=  maxNum) return NULL;

    WORD* entriesPtr = (WORD* ) parentDir->getEntriesPtr();
    if (entriesPtr == NULL) return NULL;

    WORD* ptr = &entriesPtr[this->entryNum];
    return ptr;
}